

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_matrix_matrix_multiplication_Test::
test_matrix_dense_matrix_matrix_multiplication_Test
          (test_matrix_dense_matrix_matrix_multiplication_Test *this)

{
  test_matrix_dense_matrix_matrix_multiplication_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__test_matrix_dense_matrix_matrix_multiplication_Test_001edd68;
  return;
}

Assistant:

TEST(test_matrix_dense, matrix_matrix_multiplication) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix_1 = {{5, 6}, {7, 8}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_0 = {{1, 2}, {3, 4}};
  Matrix_Dense<Scalar, 2, 2> static_matrix_1 = {{5, 6}, {7, 8}};

  Matrix_Dense<Scalar, 0, 0> result_dynamic_0 = dynamic_matrix_0 * dynamic_matrix_1;
  Matrix_Dense<Scalar, 2, 2> result_static = static_matrix_0 * static_matrix_1;
  EXPECT_EQ(dynamic_matrix_0.size_row(), 2);
  EXPECT_EQ(dynamic_matrix_0.size_column(), 2);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][0], 19);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][1], 22);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][0], 43);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][1], 50);
  EXPECT_DOUBLE_EQ(result_static[0][0], 19);
  EXPECT_DOUBLE_EQ(result_static[0][1], 22);
  EXPECT_DOUBLE_EQ(result_static[1][0], 43);
  EXPECT_DOUBLE_EQ(result_static[1][1], 50);

  result_dynamic_0 = dynamic_matrix_0 * static_matrix_1;
  Matrix_Dense<Scalar, 0, 0> result_dynamic_1 = static_matrix_0 * dynamic_matrix_1;
  EXPECT_EQ(dynamic_matrix_0.size_row(), 2);
  EXPECT_EQ(dynamic_matrix_0.size_column(), 2);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][0], 19);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][1], 22);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][0], 43);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][1], 50);
  EXPECT_EQ(dynamic_matrix_0.size_row(), 2);
  EXPECT_EQ(dynamic_matrix_0.size_column(), 2);
  EXPECT_DOUBLE_EQ(result_dynamic_1[0][0], 19);
  EXPECT_DOUBLE_EQ(result_dynamic_1[0][1], 22);
  EXPECT_DOUBLE_EQ(result_dynamic_1[1][0], 43);
  EXPECT_DOUBLE_EQ(result_dynamic_1[1][1], 50);

  // non-square
  dynamic_matrix_0 = {{1, 2}, {3, 4}, {5, 6}};
  dynamic_matrix_1 = {{7, 8, 9, 10}, {11, 12, 13, 14}};
  result_dynamic_0 = dynamic_matrix_0 * dynamic_matrix_1;
  EXPECT_EQ(result_dynamic_0.size_row(), 3);
  EXPECT_EQ(result_dynamic_0.size_column(), 4);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][0], 29);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][1], 32);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][2], 35);
  EXPECT_DOUBLE_EQ(result_dynamic_0[0][3], 38);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][0], 65);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][1], 72);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][2], 79);
  EXPECT_DOUBLE_EQ(result_dynamic_0[1][3], 86);
  EXPECT_DOUBLE_EQ(result_dynamic_0[2][0], 101);
  EXPECT_DOUBLE_EQ(result_dynamic_0[2][1], 112);
  EXPECT_DOUBLE_EQ(result_dynamic_0[2][2], 123);
  EXPECT_DOUBLE_EQ(result_dynamic_0[2][3], 134);

  dynamic_matrix_0.resize(1, 1);
  Matrix_Dense<Scalar, 2, 3> incorrect;
  EXPECT_DEATH(dynamic_matrix_1 * incorrect, "./*");
  EXPECT_DEATH(dynamic_matrix_1 * dynamic_matrix_0, "./*");
  EXPECT_DEATH(static_matrix_0 * incorrect, "./*");
  EXPECT_DEATH(static_matrix_0 * dynamic_matrix_0, "./*");
}